

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O2

void __thiscall OpenMD::NPA::moveB(NPA *this)

{
  pointer pVVar1;
  Thermo *this_00;
  int iVar2;
  Molecule *pMVar3;
  long lVar4;
  StuntDouble *pSVar5;
  long lVar6;
  ulong uVar7;
  pointer ppSVar8;
  RealType RVar9;
  MoleculeIterator i;
  Vector3d sc;
  Vector3d frc;
  Vector3d vel;
  Vector3d ji;
  Vector3d Tb;
  long local_148;
  MoleculeIterator local_140;
  ulong local_138;
  Thermo *local_130;
  ulong local_128;
  Molecule *local_120;
  double local_118;
  pointer local_110;
  Vector<double,_3U> local_108;
  Vector<double,_3U> local_f0;
  Vector<double,_3U> local_d8;
  Vector<double,_3U> local_c0;
  Vector<double,_3U> local_a8;
  Vector<double,_3U> local_90;
  Vector<double,_3U> local_78;
  Vector<double,_3U> local_60;
  Vector<double,_3U> local_48;
  
  local_140._M_node = (_Base_ptr)0x0;
  Vector<double,_3U>::Vector(&local_78);
  Vector<double,_3U>::Vector(&local_90);
  Vector<double,_3U>::Vector(&local_f0);
  Vector<double,_3U>::Vector(&local_a8);
  Vector<double,_3U>::Vector(&local_c0);
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x18])(this);
  pMVar3 = SimInfo::beginMolecule
                     ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                      &local_140);
  lVar4 = 0;
  while (pMVar3 != (Molecule *)0x0) {
    ppSVar8 = (pMVar3->integrableObjects_).
              super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if (ppSVar8 ==
        (pMVar3->integrableObjects_).
        super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      pSVar5 = (StuntDouble *)0x0;
    }
    else {
      pSVar5 = *ppSVar8;
    }
    lVar4 = (long)(int)lVar4;
    lVar6 = lVar4 * 0x18;
    while (ppSVar8 = ppSVar8 + 1, pSVar5 != (StuntDouble *)0x0) {
      StuntDouble::getVel((Vector3d *)&local_108,pSVar5);
      Vector<double,_3U>::operator=
                ((Vector<double,_3U> *)
                 ((long)(((this->super_NPT).oldVel.
                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                        data_ + lVar6),&local_108);
      if (pSVar5->objType_ - otDAtom < 2) {
        StuntDouble::getJ((Vector3d *)&local_108,pSVar5);
        Vector<double,_3U>::operator=
                  ((Vector<double,_3U> *)
                   ((long)(((this->super_NPT).oldJi.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->super_Vector<double,_3U>).
                          data_ + lVar6),&local_108);
      }
      if (ppSVar8 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar5 = (StuntDouble *)0x0;
      }
      else {
        pSVar5 = *ppSVar8;
      }
      lVar6 = lVar6 + 0x18;
      lVar4 = lVar4 + 1;
    }
    pMVar3 = SimInfo::nextMolecule
                       ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                        &local_140);
  }
  local_130 = &(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.thermo;
  RVar9 = Thermo::getVolume(local_130);
  (this->super_NPT).instaVol = RVar9;
  uVar7 = 0;
  do {
    this_00 = local_130;
    if ((this->super_NPT).maxIterNum_ <= (int)uVar7) break;
    local_128 = uVar7;
    RVar9 = Thermo::getTemperature(local_130);
    (this->super_NPT).instaTemp = RVar9;
    RVar9 = Thermo::getPressure(this_00);
    (this->super_NPT).instaPress = RVar9;
    (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x16])
              (this);
    (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x13])
              (this);
    pMVar3 = SimInfo::beginMolecule
                       ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                        &local_140);
    uVar7 = 0;
    while (pMVar3 != (Molecule *)0x0) {
      ppSVar8 = (pMVar3->integrableObjects_).
                super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
                _M_impl.super__Vector_impl_data._M_start;
      if (ppSVar8 ==
          (pMVar3->integrableObjects_).
          super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        pSVar5 = (StuntDouble *)0x0;
      }
      else {
        pSVar5 = *ppSVar8;
      }
      uVar7 = (ulong)(int)uVar7;
      local_148 = uVar7 * 0x18;
      local_120 = pMVar3;
      while (pSVar5 != (StuntDouble *)0x0) {
        local_110 = ppSVar8 + 1;
        StuntDouble::getFrc((Vector3d *)&local_108,pSVar5);
        Vector<double,_3U>::operator=(&local_c0,&local_108);
        local_118 = pSVar5->mass_;
        local_138 = uVar7;
        (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x11])
                  (this,&local_f0,uVar7 & 0xffffffff);
        pVVar1 = (this->super_NPT).oldVel.
                 super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        operator*(&local_48,
                  ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 * 0.0004184
                  ) / local_118,&local_c0);
        OpenMD::operator+(&local_d8,
                          (Vector<double,_3U> *)
                          ((long)(pVVar1->super_Vector<double,_3U>).data_ + local_148),&local_48);
        operator*(&local_60,(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2,
                  &local_f0);
        operator-(&local_108,&local_d8,&local_60);
        Vector3<double>::operator=((Vector3<double> *)&local_a8,&local_108);
        StuntDouble::setVel(pSVar5,(Vector3d *)&local_a8);
        if (pSVar5->objType_ - otDAtom < 2) {
          StuntDouble::getTrq((Vector3d *)&local_d8,pSVar5);
          StuntDouble::lab2Body((Vector3d *)&local_108,pSVar5,(Vector3d *)&local_d8);
          Vector<double,_3U>::operator=(&local_78,&local_108);
          pVVar1 = (this->super_NPT).oldJi.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          operator*(&local_d8,
                    (this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.dt2 *
                    0.0004184,&local_78);
          OpenMD::operator+(&local_108,
                            (Vector<double,_3U> *)
                            ((long)(pVVar1->super_Vector<double,_3U>).data_ + local_148),&local_d8);
          Vector3<double>::operator=((Vector3<double> *)&local_90,&local_108);
          StuntDouble::setJ(pSVar5,(Vector3d *)&local_90);
        }
        if (local_110 ==
            (local_120->integrableObjects_).
            super__Vector_base<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>.
            _M_impl.super__Vector_impl_data._M_finish) {
          pSVar5 = (StuntDouble *)0x0;
        }
        else {
          pSVar5 = *local_110;
        }
        local_148 = local_148 + 0x18;
        uVar7 = local_138 + 1;
        ppSVar8 = local_110;
      }
      pMVar3 = SimInfo::nextMolecule
                         ((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.info_,
                          &local_140);
    }
    Rattle::constraintB((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.rattle_);
    iVar2 = (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator
              [0x14])(this);
    uVar7 = (ulong)((int)local_128 + 1);
  } while ((char)iVar2 == '\0');
  (*((this->super_NPT).super_VelocityVerletIntegrator.super_Integrator.flucQ_)->
    _vptr_FluctuatingChargePropagator[6])();
  (*(this->super_NPT).super_VelocityVerletIntegrator.super_Integrator._vptr_Integrator[0x19])(this);
  return;
}

Assistant:

void NPA::moveB(void) {
    SimInfo::MoleculeIterator i;
    Molecule::IntegrableObjectIterator j;
    Molecule* mol;
    StuntDouble* sd;
    int index;
    Vector3d Tb;
    Vector3d ji;
    Vector3d sc;
    Vector3d vel;
    Vector3d frc;
    RealType mass;

    loadEta();

    // save velocity and angular momentum
    index = 0;
    for (mol = info_->beginMolecule(i); mol != NULL;
         mol = info_->nextMolecule(i)) {
      for (sd = mol->beginIntegrableObject(j); sd != NULL;
           sd = mol->nextIntegrableObject(j)) {
        oldVel[index] = sd->getVel();

        if (sd->isDirectional()) oldJi[index] = sd->getJ();

        ++index;
      }
    }

    instaVol = thermo.getVolume();
    for (int k = 0; k < maxIterNum_; k++) {
      instaTemp  = thermo.getTemperature();
      instaPress = thermo.getPressure();

      // evolve eta
      this->evolveEtaB();
      this->calcVelScale();

      index = 0;
      for (mol = info_->beginMolecule(i); mol != NULL;
           mol = info_->nextMolecule(i)) {
        for (sd = mol->beginIntegrableObject(j); sd != NULL;
             sd = mol->nextIntegrableObject(j)) {
          frc  = sd->getFrc();
          mass = sd->getMass();

          getVelScaleB(sc, index);

          // velocity half step
          vel = oldVel[index] + dt2 * Constants::energyConvert / mass * frc -
                dt2 * sc;

          sd->setVel(vel);

          if (sd->isDirectional()) {
            // get and convert the torque to body frame
            Tb = sd->lab2Body(sd->getTrq());

            ji = oldJi[index] + dt2 * Constants::energyConvert * Tb;

            sd->setJ(ji);
          }

          ++index;
        }
      }

      rattle_->constraintB();

      if (this->etaConverged()) break;
    }

    flucQ_->moveB();
    saveEta();
  }